

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

int adiak_workdir(void)

{
  int iVar1;
  char cwd [4096];
  
  iVar1 = adksys_get_cwd(cwd,0x1000);
  if (iVar1 == 1) {
    iVar1 = -1;
  }
  else {
    iVar1 = adiak_namevalue("working_directory",2,"runinfo","%p",cwd);
  }
  return iVar1;
}

Assistant:

int adiak_workdir()
{
   char cwd[FILENAME_MAX];
   int result = adksys_get_cwd(cwd, FILENAME_MAX);
   if (result == 1)
      return -1;
   result = adiak_namevalue("working_directory", adiak_general, "runinfo", "%p", cwd);
   return result;
}